

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_destructor.h
# Opt level: O0

Nonnull<const_std::__cxx11::basic_string<char>_*>
absl::lts_20250127::NoDestructor<std::__cxx11::string>::PlacementImpl::
Launder<std::__cxx11::string_const>(Nonnull<const_std::__cxx11::basic_string<char>_*> p)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  Nonnull<const_std::__cxx11::basic_string<char>_*> p_local;
  
  pbVar1 = std::launder<std::__cxx11::string_const>(p);
  return pbVar1;
}

Assistant:

static absl::Nonnull<P*> Launder(absl::Nonnull<P*> p) {
#if defined(__cpp_lib_launder) && __cpp_lib_launder >= 201606L
      return std::launder(p);
#elif ABSL_HAVE_BUILTIN(__builtin_launder)
      return __builtin_launder(p);
#else
      // When `std::launder` or equivalent are not available, we rely on
      // undefined behavior, which works as intended on Abseil's officially
      // supported platforms as of Q3 2023.
#if defined(__GNUC__) && !defined(__clang__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wstrict-aliasing"
#endif
      return p;
#if defined(__GNUC__) && !defined(__clang__)
#pragma GCC diagnostic pop
#endif
#endif
    }